

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reflectance.cpp
# Opt level: O1

Spectrum * __thiscall
phyr::MicrofacetReflection::f
          (Spectrum *__return_storage_ptr__,MicrofacetReflection *this,Vector3f *wo,Vector3f *wi)

{
  double *pdVar1;
  double dVar2;
  undefined1 auVar3 [16];
  undefined4 in_EAX;
  uint uVar4;
  long lVar5;
  double dVar6;
  double dVar7;
  double extraout_XMM0_Qa;
  double extraout_XMM0_Qa_00;
  undefined1 auVar8 [16];
  double dVar9;
  double dVar10;
  double dVar11;
  CoefficientSpectrum<60> cs;
  CoefficientSpectrum<60> cs_1;
  CoefficientSpectrum<60> cs_2;
  CoefficientSpectrum<60> cs_3;
  Spectrum F;
  double local_988 [120];
  double local_5c8 [60];
  undefined1 local_3e8 [480];
  double local_208 [60];
  
  dVar10 = wo->z;
  dVar2 = wi->z;
  dVar9 = wo->x + wi->x;
  dVar11 = wo->y + wi->y;
  dVar6 = dVar10 + dVar2;
  if (((dVar10 == 0.0) && (!NAN(dVar10))) || ((dVar2 == 0.0 && (!NAN(dVar2))))) {
LAB_0013ceb7:
    memset(__return_storage_ptr__,0,0x1e0);
  }
  else {
    if ((dVar6 == 0.0) && (!NAN(dVar6))) {
      auVar8._8_8_ = -(ulong)(dVar11 == 0.0);
      auVar8._0_8_ = -(ulong)(dVar9 == 0.0);
      uVar4 = movmskpd(in_EAX,auVar8);
      if (((uVar4 & 1) != 0) && ((byte)((byte)uVar4 >> 1) != 0)) goto LAB_0013ceb7;
    }
    dVar7 = dVar6 * dVar6 + dVar9 * dVar9 + dVar11 * dVar11;
    if (dVar7 < 0.0) {
      dVar7 = sqrt(dVar7);
    }
    else {
      dVar7 = SQRT(dVar7);
    }
    dVar7 = 1.0 / dVar7;
    (**this->fresnel->_vptr_Fresnel)
              (dVar6 * dVar7 * wi->z + dVar7 * dVar9 * wi->x + dVar7 * dVar11 * wi->y,local_208);
    (*this->distribution->_vptr_MicrofacetDistribution[2])();
    lVar5 = 0;
    memset(local_988,0,0x1e0);
    do {
      pdVar1 = (this->R).super_CoefficientSpectrum<60>.samples + lVar5;
      dVar6 = pdVar1[1];
      local_988[lVar5] = *pdVar1 * extraout_XMM0_Qa;
      local_988[lVar5 + 1] = dVar6 * extraout_XMM0_Qa;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 0x3c);
    (*this->distribution->_vptr_MicrofacetDistribution[4])(this->distribution,wo,wi);
    lVar5 = 0;
    memset(local_988 + 0x3c,0,0x1e0);
    do {
      local_988[lVar5 + 0x3c] = local_988[lVar5] * extraout_XMM0_Qa_00;
      local_988[lVar5 + 0x3d] = local_988[lVar5 + 1] * extraout_XMM0_Qa_00;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 0x3c);
    lVar5 = 0;
    memset(local_5c8,0,0x1e0);
    do {
      dVar6 = local_988[lVar5 + 0x3d];
      dVar9 = local_208[lVar5 + 1];
      local_5c8[lVar5] = local_208[lVar5] * local_988[lVar5 + 0x3c];
      local_5c8[lVar5 + 1] = dVar9 * dVar6;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 0x3c);
    lVar5 = 0;
    memset(local_3e8,0,0x1e0);
    dVar10 = ABS(dVar10) * ABS(dVar2) * 4.0;
    do {
      auVar3._8_8_ = dVar10;
      auVar3._0_8_ = dVar10;
      auVar8 = divpd(*(undefined1 (*) [16])(local_5c8 + lVar5),auVar3);
      *(undefined1 (*) [16])(local_3e8 + lVar5 * 8) = auVar8;
      lVar5 = lVar5 + 2;
    } while (lVar5 != 0x3c);
    memcpy(__return_storage_ptr__,local_3e8,0x1e0);
  }
  return __return_storage_ptr__;
}

Assistant:

Spectrum MicrofacetReflection::f(const Vector3f& wo, const Vector3f& wi) const {
    Real cosThetaO = absCosTheta(wo), cosThetaI = absCosTheta(wi);
    Vector3f wh = wi + wo;

    // Handle degenerate cases for microfacet reflection
    if (cosThetaI == 0 || cosThetaO == 0) return Spectrum(0.);
    if (wh.x == 0 && wh.y == 0 && wh.z == 0) return Spectrum(0.);
    wh = normalize(wh);
    Spectrum F = fresnel->evaluate(dot(wi, wh));

    return R * distribution->d(wh) * distribution->g(wo, wi) * F / (4 * cosThetaI * cosThetaO);
}